

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

uint64_t address_space_ldq_le_x86_64
                   (uc_struct_conflict *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  uint64_t uVar1;
  
  uVar1 = address_space_ldq_internal_x86_64(uc,as,addr,attrs,result,DEVICE_LITTLE_ENDIAN);
  return uVar1;
}

Assistant:

uint64_t glue(address_space_ldq_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_ldq_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                    DEVICE_LITTLE_ENDIAN);
}